

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>::~QArrayDataPointer
          (QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *this)

{
  Data *pDVar1;
  QVariant *this_00;
  long lVar2;
  
  pDVar1 = this->d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      if (this->size != 0) {
        lVar2 = this->size * 0x28;
        this_00 = &this->ptr->value;
        do {
          ::QVariant::~QVariant(this_00);
          this_00 = (QVariant *)((long)(this_00 + 1) + 8);
          lVar2 = lVar2 + -0x28;
        } while (lVar2 != 0);
      }
      QArrayData::deallocate(&this->d->super_QArrayData,0x28,0x10);
      return;
    }
  }
  return;
}

Assistant:

bool deref() noexcept { return !d || d->deref(); }